

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O2

void __thiscall
QParallelAnimationGroup::updateDirection(QParallelAnimationGroup *this,Direction direction)

{
  long lVar1;
  long lVar2;
  State SVar3;
  parameter_type pVar4;
  int iVar5;
  undefined4 uVar6;
  long lVar7;
  
  lVar1 = *(long *)(this + 8);
  SVar3 = QAbstractAnimation::state((QAbstractAnimation *)this);
  if (SVar3 == Stopped) {
    if (direction == Forward) {
      *(undefined4 *)(lVar1 + 0xc0) = 0;
      uVar6 = 0;
    }
    else {
      pVar4 = QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
              ::value((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                       *)(lVar1 + 0x88));
      if (pVar4 == -1) {
        iVar5 = 0;
      }
      else {
        pVar4 = QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                ::value((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                         *)(lVar1 + 0x88));
        iVar5 = pVar4 + -1;
      }
      *(int *)(lVar1 + 0xc0) = iVar5;
      uVar6 = (**(code **)(*(long *)this + 0x60))(this);
    }
    *(undefined4 *)(lVar1 + 0xc4) = uVar6;
  }
  else {
    lVar2 = *(long *)(lVar1 + 0xa8);
    lVar1 = *(long *)(lVar1 + 0xb0);
    for (lVar7 = 0; lVar1 << 3 != lVar7; lVar7 = lVar7 + 8) {
      QAbstractAnimation::setDirection(*(QAbstractAnimation **)(lVar2 + lVar7),direction);
    }
  }
  return;
}

Assistant:

void QParallelAnimationGroup::updateDirection(QAbstractAnimation::Direction direction)
{
    Q_D(QParallelAnimationGroup);
    //we need to update the direction of the current animation
    if (state() != Stopped) {
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it)
            (*it)->setDirection(direction);
    } else {
        if (direction == Forward) {
            d->lastLoop = 0;
            d->lastCurrentTime = 0;
        } else {
            // Looping backwards with loopCount == -1 does not really work well...
            d->lastLoop = (d->loopCount == -1 ? 0 : d->loopCount - 1);
            d->lastCurrentTime = duration();
        }
    }
}